

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

UTF8Decoded __thiscall llvm::yaml::Scanner::decodeUTF8(Scanner *this,iterator Position)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(byte)*Position;
  if (*Position < '\0') {
    uVar1 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = 0x100000000;
  }
  return (UTF8Decoded)(uVar1 | uVar2);
}

Assistant:

UTF8Decoded decodeUTF8(StringRef::iterator Position) {
    return ::decodeUTF8(StringRef(Position, End - Position));
  }